

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

SeatPromptResult *
cmdline_get_passwd_input
          (SeatPromptResult *__return_storage_ptr__,prompts_t *p,
          cmdline_get_passwd_input_state *state,_Bool restartable)

{
  char *b;
  size_t n;
  _Bool restartable_local;
  cmdline_get_passwd_input_state *state_local;
  prompts_t *p_local;
  
  if ((p->n_prompts == 1) && (((*p->prompts)->echo & 1U) == 0)) {
    if ((state->tried & 1U) == 0) {
      if (cmdline_password == (char *)0x0) {
        make_spr_simple(__return_storage_ptr__,SPRK_INCOMPLETE);
      }
      else {
        prompt_set_result(*p->prompts,cmdline_password);
        state->tried = true;
        b = cmdline_password;
        if (!restartable) {
          n = strlen(cmdline_password);
          smemclr(b,n);
          safefree(cmdline_password);
          cmdline_password = (char *)0x0;
        }
        make_spr_simple(__return_storage_ptr__,SPRK_OK);
      }
    }
    else {
      make_spr_sw_abort_static(__return_storage_ptr__,"Configured password was not accepted");
    }
  }
  else {
    make_spr_simple(__return_storage_ptr__,SPRK_INCOMPLETE);
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult cmdline_get_passwd_input(
    prompts_t *p, cmdline_get_passwd_input_state *state, bool restartable)
{
    /*
     * We only handle prompts which don't echo (which we assume to be
     * passwords), and (currently) we only cope with a password prompt
     * that comes in a prompt-set on its own.
     */
    if (p->n_prompts != 1 || p->prompts[0]->echo) {
        return SPR_INCOMPLETE;
    }

    /*
     * If we've tried once, return utter failure (no more passwords left
     * to try).
     */
    if (state->tried)
        return SPR_SW_ABORT("Configured password was not accepted");

    /*
     * If we never had a password available in the first place, we
     * can't do anything in any case. (But we delay this test until
     * after trying once, so that even if we free cmdline_password
     * below, we'll still remember that we _used_ to have one.)
     */
    if (!cmdline_password)
        return SPR_INCOMPLETE;

    prompt_set_result(p->prompts[0], cmdline_password);
    state->tried = true;

    if (!restartable) {
        /*
         * If there's no possibility of needing to do this again after
         * a 'Restart Session' event, then wipe our copy of the
         * password out of memory.
         */
        smemclr(cmdline_password, strlen(cmdline_password));
        sfree(cmdline_password);
        cmdline_password = NULL;
    }

    return SPR_OK;
}